

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# specwriter.cpp
# Opt level: O0

string * apngasm::spec::anon_unknown_0::createRelativeDir
                   (string *__return_storage_ptr__,string *from,string *to)

{
  char cVar1;
  bool bVar2;
  reference pcVar3;
  unsigned_long *puVar4;
  reference pvVar5;
  size_type sVar6;
  int local_228;
  char currentChar;
  int i_1;
  bool beforeIsSeparator;
  string parentDir;
  int count_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d8;
  char local_1b2;
  char local_1b1;
  int local_1b0;
  char toChar;
  int iStack_1ac;
  char fromChar;
  int i;
  int find;
  size_type local_1a0;
  int local_194;
  undefined1 local_190 [4];
  int count;
  string toDir;
  string fromDir;
  path local_148;
  path local_120;
  string local_f8;
  undefined1 local_d8 [8];
  string local_d0;
  undefined1 local_b0 [16];
  undefined1 local_a0 [8];
  string separatorStr;
  undefined1 local_70 [8];
  path toPath;
  path fromPath;
  string *to_local;
  string *from_local;
  string *result;
  
  createAbsolutePath((path *)&toPath._M_cmpts,from);
  createAbsolutePath((path *)local_70,to);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_a0,1,'/',(allocator<char> *)(local_b0 + 0xf));
  std::allocator<char>::~allocator((allocator<char> *)(local_b0 + 0xf));
  std::filesystem::__cxx11::path::make_preferred((path *)&toPath._M_cmpts);
  std::filesystem::__cxx11::path::make_preferred((path *)local_70);
  std::filesystem::__cxx11::path::string((string *)(local_d8 + 8),(path *)&toPath._M_cmpts);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::rbegin
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b0);
  pcVar3 = std::
           reverse_iterator<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::operator*((reverse_iterator<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)local_b0);
  cVar1 = *pcVar3;
  std::__cxx11::string::~string((string *)(local_d8 + 8));
  if (cVar1 != '/') {
    std::filesystem::__cxx11::path::operator/=
              ((path *)&toPath._M_cmpts,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a0);
  }
  std::filesystem::__cxx11::path::string(&local_f8,(path *)local_70);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::rbegin
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d8);
  pcVar3 = std::
           reverse_iterator<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::operator*((reverse_iterator<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)local_d8);
  cVar1 = *pcVar3;
  std::__cxx11::string::~string((string *)&local_f8);
  if (cVar1 != '/') {
    std::filesystem::__cxx11::path::operator/=
              ((path *)local_70,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a0);
  }
  std::filesystem::__cxx11::path::root_name();
  std::filesystem::__cxx11::path::root_name();
  bVar2 = std::filesystem::__cxx11::operator==(&local_120,&local_148);
  std::filesystem::__cxx11::path::~path(&local_148);
  std::filesystem::__cxx11::path::~path(&local_120);
  if (((bVar2 ^ 0xffU) & 1) == 0) {
    std::filesystem::__cxx11::path::string
              ((string *)((long)&toDir.field_2 + 8),(path *)&toPath._M_cmpts);
    std::filesystem::__cxx11::path::string((string *)local_190,(path *)local_70);
    local_1a0 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                length((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       ((long)&toDir.field_2 + 8));
    _i = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::length
                   ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_190);
    puVar4 = std::min<unsigned_long>(&local_1a0,(unsigned_long *)&i);
    local_194 = (int)*puVar4;
    iStack_1ac = -1;
    for (local_1b0 = 0; local_1b0 < local_194; local_1b0 = local_1b0 + 1) {
      pvVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::at
                         ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          ((long)&toDir.field_2 + 8),(long)local_1b0);
      local_1b1 = *pvVar5;
      pvVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::at
                         ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_190,(long)local_1b0);
      local_1b2 = *pvVar5;
      if (local_1b1 != local_1b2) break;
      if (local_1b1 == '/') {
        iStack_1ac = local_1b0;
      }
    }
    if (iStack_1ac != -1) {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                (&local_1d8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&toDir.field_2 + 8),(long)(iStack_1ac + 1),0xffffffffffffffff);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&toDir.field_2 + 8),&local_1d8);
      std::__cxx11::string::~string((string *)&local_1d8);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&count_1,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_190,
                 (long)(iStack_1ac + 1),0xffffffffffffffff);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_190,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&count_1);
      std::__cxx11::string::~string((string *)&count_1);
    }
    parentDir.field_2._M_local_buf[0xf] = '\0';
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"",
               (allocator<char> *)(parentDir.field_2._M_local_buf + 0xe));
    std::allocator<char>::~allocator((allocator<char> *)(parentDir.field_2._M_local_buf + 0xe));
    bVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::empty
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       ((long)&toDir.field_2 + 8));
    if (!bVar2) {
      sVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              length((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&toDir.field_2 + 8));
      parentDir.field_2._8_4_ = (undefined4)sVar6;
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&i_1,"..",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a0);
      bVar2 = true;
      for (local_228 = 0; local_228 < (int)parentDir.field_2._8_4_; local_228 = local_228 + 1) {
        pvVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::at
                           ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            ((long)&toDir.field_2 + 8),(long)local_228);
        if (*pvVar5 == '/') {
          if (!bVar2) {
            std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            operator+=(__return_storage_ptr__,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&i_1);
            bVar2 = true;
          }
        }
        else {
          bVar2 = false;
        }
      }
      std::__cxx11::string::~string((string *)&i_1);
    }
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
              (__return_storage_ptr__,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_190);
    parentDir.field_2._M_local_buf[0xf] = '\x01';
    std::__cxx11::string::~string((string *)local_190);
    std::__cxx11::string::~string((string *)(toDir.field_2._M_local_buf + 8));
  }
  else {
    std::filesystem::__cxx11::path::string(__return_storage_ptr__,(path *)&toPath._M_cmpts);
  }
  std::__cxx11::string::~string((string *)local_a0);
  std::filesystem::__cxx11::path::~path((path *)local_70);
  std::filesystem::__cxx11::path::~path((path *)&toPath._M_cmpts);
  return __return_storage_ptr__;
}

Assistant:

const std::string createRelativeDir(const std::string& from, const std::string& to)
      {
        std::filesystem::path fromPath = createAbsolutePath(from);
        std::filesystem::path toPath = createAbsolutePath(to);
        const std::string separatorStr = std::string(1, separator);

        // Convert path to native.
        fromPath.make_preferred();
        toPath.make_preferred();
        if (*fromPath.string().rbegin() != separator)
          fromPath /= separatorStr;
        if (*toPath.string().rbegin() != separator)
          toPath /= separatorStr;

        // Other drive.
        if(fromPath.root_name() != toPath.root_name())
          return fromPath.string();

        // Same drive.
        std::string fromDir = fromPath.string();
        std::string toDir = toPath.string();

        {
          const int count = std::min(fromDir.length(), toDir.length());
          int find = -1;
          for (int i = 0;  i < count;  ++i) {
            const char fromChar = fromDir.at(i);
            const char toChar = toDir.at(i);

            if (fromChar == toChar) {
              if (fromChar == separator)
                find = i;
            }
            else
              break;
          } if (find != -1) {
            fromDir = fromDir.substr(find + 1);
            toDir = toDir.substr(find + 1);
          }
        }

        std::string result = "";
        if (!fromDir.empty()) {
          const int count = fromDir.length();
          const std::string parentDir = ".." + separatorStr;
          bool beforeIsSeparator = true;
          for (int i = 0;  i < count;  ++i) {
            const char currentChar = fromDir.at(i);
            if (currentChar == separator) {
              if (!beforeIsSeparator) {
                result += parentDir;
                beforeIsSeparator = true;
              }
            } else {
              beforeIsSeparator = false;
            }
          }
        }
        result += toDir;

        return result;
      }